

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Create_config(int type,int ndim,int *dims,char *name,int *chunk,int p_handle)

{
  ulong uVar1;
  Integer *chunk_00;
  logical lVar2;
  ulong uVar3;
  int iVar4;
  Integer g_a;
  Integer _ga_work [7];
  Integer _ga_dims [7];
  int local_90 [2];
  Integer local_88 [8];
  Integer local_48 [7];
  
  iVar4 = 0;
  if (ndim < 8) {
    uVar1 = 0;
    uVar3 = 0;
    if (0 < ndim) {
      uVar3 = (ulong)(uint)ndim;
    }
    iVar4 = ndim + -1;
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      local_48[iVar4] = (long)dims[uVar1];
      iVar4 = iVar4 + -1;
    }
    if (chunk == (int *)0x0) {
      chunk_00 = (Integer *)0x0;
    }
    else {
      iVar4 = ndim + -1;
      chunk_00 = local_88;
      for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
        local_88[iVar4] = (long)chunk[uVar1];
        iVar4 = iVar4 + -1;
      }
    }
    lVar2 = pnga_create_config((long)type,(long)ndim,local_48,name,chunk_00,(long)p_handle,
                               (Integer *)local_90);
    iVar4 = 0;
    if (lVar2 == 1) {
      iVar4 = local_90[0];
    }
  }
  return iVar4;
}

Assistant:

int NGA_Create_config(int type, int ndim, int dims[], char *name, int chunk[],
                      int p_handle)
{
    Integer *ptr, g_a; 
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    if(!chunk)ptr=(Integer*)0;  
    else {
         COPYC2F(chunk,_ga_work, ndim);
         ptr = _ga_work;
    }
    st = wnga_create_config((Integer)type, (Integer)ndim, _ga_dims, name, ptr,
                    (Integer)p_handle, &g_a);
    if(st==TRUE) return (int) g_a;
    else return 0;
}